

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O3

void __thiscall
Assimp::COBImporter::ReadMat1_Ascii
          (COBImporter *this,Scene *out,LineSplitter *splitter,ChunkInfo *nfo)

{
  byte bVar1;
  int *piVar2;
  pointer pMVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Logger *pLVar7;
  byte *pbVar8;
  ulong uVar9;
  range_error *prVar10;
  long lVar11;
  uint uVar12;
  byte *pbVar13;
  ai_real ret;
  string shader;
  char *tokens [10];
  char *rgb;
  float local_1f8;
  undefined4 uStack_1f4;
  undefined1 local_1e8 [16];
  char *local_1d8 [2];
  char local_1c8 [16];
  undefined1 local_1b8 [8];
  char *pcStack_1b0;
  _Alloc_hider local_1a8;
  char *local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_198;
  aiColor3D local_188;
  float fStack_17c;
  float fStack_178;
  float fStack_174;
  float fStack_170;
  float local_16c;
  uint uStack_168;
  undefined8 local_164;
  undefined8 uStack_15c;
  undefined4 local_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 local_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  byte *local_38;
  
  if (8 < nfo->version) {
    UnsupportedChunk_Ascii(this,splitter,nfo,"Mat1");
    return;
  }
  LineSplitter::operator++(splitter);
  if ((4 < (splitter->mCur)._M_string_length) &&
     (piVar2 = (int *)(splitter->mCur)._M_dataplus._M_p,
     (char)piVar2[1] == ' ' && *piVar2 == 0x2374616d)) {
    local_1b8 = (undefined1  [8])0x0;
    pcStack_1b0 = (char *)0xffffffff00000000;
    local_1a0 = (char *)0x0;
    local_198._M_local_buf[0] = '\0';
    local_188.r = 0.0;
    local_188.g = 0.0;
    local_188.b = 0.0;
    fStack_17c = 0.0;
    fStack_178 = 0.0;
    fStack_174 = 0.0;
    fStack_170 = 0.0;
    local_16c = 1.0;
    uStack_168 = 0xffffffff;
    local_164 = 0;
    uStack_15c = 0;
    local_154 = 0;
    uStack_150 = 0;
    uStack_14c = 0;
    uStack_148 = 0;
    local_144 = 0;
    uStack_140 = 0;
    uStack_13c = 0;
    uStack_138 = 0;
    uStack_134 = 0;
    local_130._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8._M_p = (pointer)&local_198;
    std::vector<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>::
    emplace_back<Assimp::COB::Material>(&out->materials,(Material *)local_1b8);
    if (local_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_130._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_13c,uStack_140) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_13c,uStack_140));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_14c,uStack_150) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_14c,uStack_150));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_p != &local_198) {
      operator_delete(local_1a8._M_p);
    }
    pMVar3 = (out->materials).
             super__Vector_base<Assimp::COB::Material,_std::allocator<Assimp::COB::Material>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    uVar12 = nfo->parent_id;
    uVar4 = nfo->version;
    uVar5 = nfo->size;
    pMVar3[-1].super_ChunkInfo.id = nfo->id;
    pMVar3[-1].super_ChunkInfo.parent_id = uVar12;
    pMVar3[-1].super_ChunkInfo.version = uVar4;
    pMVar3[-1].super_ChunkInfo.size = uVar5;
    pbVar13 = (byte *)(splitter->mCur)._M_dataplus._M_p;
    do {
      do {
        pbVar8 = pbVar13 + 1;
        bVar1 = *pbVar13;
        pbVar13 = pbVar8;
      } while (bVar1 == 9);
    } while (bVar1 == 0x20);
    do {
      uVar9 = (ulong)bVar1;
      if (bVar1 < 0x21) {
        if ((0x100000200U >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00479585;
        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00479a62;
      }
      bVar1 = *pbVar8;
      pbVar8 = pbVar8 + 1;
    } while( true );
  }
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[38]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar7,local_1d8[0]);
  goto LAB_00479444;
LAB_00479ac6:
  prVar10 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(prVar10,"Token index out of range, EOL reached");
  goto LAB_00479a7e;
LAB_00479a62:
  prVar10 = (range_error *)__cxa_allocate_exception(0x10);
  std::range_error::range_error(prVar10,"Token index out of range, EOL reached");
LAB_00479a7e:
  __cxa_throw(prVar10,&std::range_error::typeinfo,std::range_error::~range_error);
LAB_00479585:
  while (((char)uVar9 == ' ' || ((int)uVar9 == 9))) {
    bVar1 = *pbVar8;
    pbVar8 = pbVar8 + 1;
    uVar9 = (ulong)bVar1;
  }
  uVar12 = 0;
  if (0xf5 < (byte)((char)uVar9 - 0x3aU)) {
    uVar12 = 0;
    do {
      uVar12 = (uint)(byte)((char)uVar9 - 0x30) + uVar12 * 10;
      bVar1 = *pbVar8;
      uVar9 = (ulong)bVar1;
      pbVar8 = pbVar8 + 1;
    } while (0xf5 < (byte)(bVar1 - 0x3a));
  }
  pMVar3[-1].matnum = uVar12;
  LineSplitter::operator++(splitter);
  if ((7 < (splitter->mCur)._M_string_length) &&
     (pbVar13 = (byte *)(splitter->mCur)._M_dataplus._M_p, *(long *)pbVar13 == 0x203a726564616873))
  {
    for (; (bVar1 = *pbVar13, bVar1 == 9 || (bVar1 == 0x20)); pbVar13 = pbVar13 + 1) {
    }
    do {
      uVar9 = (ulong)bVar1;
      if (bVar1 < 0x21) {
        if ((0x100000200U >> (uVar9 & 0x3f) & 1) != 0) {
          while (((char)uVar9 == ' ' || ((int)uVar9 == 9))) {
            pbVar8 = pbVar13 + 1;
            pbVar13 = pbVar13 + 1;
            uVar9 = (ulong)*pbVar8;
          }
          std::__cxx11::string::string((string *)local_1d8,(char *)pbVar13,(allocator *)local_1b8);
          std::__cxx11::string::find_first_of((char *)local_1d8,0x768c04,0);
          std::__cxx11::string::substr((ulong)local_1b8,(ulong)local_1d8);
          std::__cxx11::string::operator=((string *)local_1d8,(string *)local_1b8);
          if (local_1b8 != (undefined1  [8])&local_1a8) {
            operator_delete((void *)local_1b8);
          }
          iVar6 = std::__cxx11::string::compare((char *)local_1d8);
          if (iVar6 == 0) {
            pMVar3[-1].shader = METAL;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)local_1d8);
            if (iVar6 == 0) {
              pMVar3[-1].shader = PHONG;
            }
            else {
              iVar6 = std::__cxx11::string::compare((char *)local_1d8);
              if (iVar6 != 0) {
                pLVar7 = DefaultLogger::get();
                Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                basic_formatter<char[44]>
                          ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_1b8,(char (*) [44])"Unknown value for `shader` in `Mat1` chunk ");
                std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
                std::__cxx11::stringbuf::str();
                Logger::warn(pLVar7,(char *)CONCAT44(uStack_1f4,local_1f8));
                if ((undefined1 *)CONCAT44(uStack_1f4,local_1f8) != local_1e8) {
                  operator_delete((undefined1 *)CONCAT44(uStack_1f4,local_1f8));
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                std::ios_base::~ios_base((ios_base *)&uStack_148);
              }
            }
          }
          LineSplitter::operator++(splitter);
          if (((splitter->mCur)._M_string_length < 4) ||
             (local_38 = (byte *)(splitter->mCur)._M_dataplus._M_p, *(int *)local_38 != 0x20626772))
          {
            pLVar7 = DefaultLogger::get();
            Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
            basic_formatter<char[37]>
                      ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,(char (*) [37])"Expected `rgb` line in `Mat1` chunk ");
            std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
            std::__cxx11::stringbuf::str();
            Logger::warn(pLVar7,(char *)CONCAT44(uStack_1f4,local_1f8));
            if ((undefined1 *)CONCAT44(uStack_1f4,local_1f8) != local_1e8) {
              operator_delete((undefined1 *)CONCAT44(uStack_1f4,local_1f8));
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)&uStack_148);
            local_38 = (byte *)(splitter->mCur)._M_dataplus._M_p;
          }
          for (; (bVar1 = *local_38, bVar1 == 9 || (bVar1 == 0x20)); local_38 = local_38 + 1) {
          }
          do {
            uVar9 = (ulong)bVar1;
            if (bVar1 < 0x21) {
              if ((0x100000200U >> (uVar9 & 0x3f) & 1) != 0) {
                while (((char)uVar9 == ' ' || ((int)uVar9 == 9))) {
                  pbVar13 = local_38 + 1;
                  local_38 = local_38 + 1;
                  uVar9 = (ulong)*pbVar13;
                }
                ReadFloat3Tuple_Ascii<aiColor3D>(this,&pMVar3[-1].rgb,(char **)&local_38);
                LineSplitter::operator++(splitter);
                if (((splitter->mCur)._M_string_length < 6) ||
                   (pbVar13 = (byte *)(splitter->mCur)._M_dataplus._M_p,
                   *(short *)(pbVar13 + 4) != 0x2061 || *(int *)pbVar13 != 0x68706c61)) {
                  pLVar7 = DefaultLogger::get();
                  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
                  basic_formatter<char[39]>
                            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *
                             )local_1b8,(char (*) [39])"Expected `alpha` line in `Mat1` chunk ");
                  std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
                  std::__cxx11::stringbuf::str();
                  Logger::warn(pLVar7,(char *)CONCAT44(uStack_1f4,local_1f8));
                  if ((undefined1 *)CONCAT44(uStack_1f4,local_1f8) != local_1e8) {
                    operator_delete((undefined1 *)CONCAT44(uStack_1f4,local_1f8));
                  }
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                  std::ios_base::~ios_base((ios_base *)&uStack_148);
                  pbVar13 = (byte *)(splitter->mCur)._M_dataplus._M_p;
                }
                while( true ) {
                  bVar1 = *pbVar13;
                  uVar9 = (ulong)bVar1;
                  if ((bVar1 != 9) && (bVar1 != 0x20)) break;
                  pbVar13 = pbVar13 + 1;
                }
                lVar11 = 0;
                do {
                  if (((byte)uVar9 < 0xe) && ((0x3401U >> ((uint)uVar9 & 0x1f) & 1) != 0)) {
                    prVar10 = (range_error *)__cxa_allocate_exception(0x10);
                    std::range_error::range_error(prVar10,"Token count out of range, EOL reached");
                    __cxa_throw(prVar10,&std::range_error::typeinfo,std::range_error::~range_error);
                  }
                  *(byte **)(local_1b8 + lVar11 * 8) = pbVar13;
                  while ((uVar9 = (ulong)*pbVar13, 0x20 < uVar9 ||
                         ((0x100000201U >> (uVar9 & 0x3f) & 1) == 0))) {
                    pbVar13 = pbVar13 + 1;
                  }
                  while (((char)uVar9 == ' ' || ((int)uVar9 == 9))) {
                    pbVar8 = pbVar13 + 1;
                    pbVar13 = pbVar13 + 1;
                    uVar9 = (ulong)*pbVar8;
                  }
                  lVar11 = lVar11 + 1;
                } while (lVar11 != 10);
                local_1f8 = 0.0;
                fast_atoreal_move<float>(pcStack_1b0,&local_1f8,true);
                pMVar3[-1].alpha = local_1f8;
                local_1f8 = 0.0;
                fast_atoreal_move<float>(local_1a0,&local_1f8,true);
                pMVar3[-1].ka = local_1f8;
                local_1f8 = 0.0;
                fast_atoreal_move<float>((char *)local_198._8_8_,&local_1f8,true);
                pMVar3[-1].ks = local_1f8;
                local_1f8 = 0.0;
                fast_atoreal_move<float>((char *)CONCAT44(fStack_17c,local_188.b),&local_1f8,true);
                pMVar3[-1].exp = local_1f8;
                local_1f8 = 0.0;
                fast_atoreal_move<float>((char *)CONCAT44(local_16c,fStack_170),&local_1f8,true);
                pMVar3[-1].ior = local_1f8;
                if (local_1d8[0] == local_1c8) {
                  return;
                }
                operator_delete(local_1d8[0]);
                return;
              }
              if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) {
                prVar10 = (range_error *)__cxa_allocate_exception(0x10);
                std::range_error::range_error(prVar10,"Token index out of range, EOL reached");
                __cxa_throw(prVar10,&std::range_error::typeinfo,std::range_error::~range_error);
              }
            }
            bVar1 = local_38[1];
            local_38 = local_38 + 1;
          } while( true );
        }
        if ((0x3401UL >> (uVar9 & 0x3f) & 1) != 0) goto LAB_00479ac6;
      }
      bVar1 = pbVar13[1];
      pbVar13 = pbVar13 + 1;
    } while( true );
  }
  pLVar7 = DefaultLogger::get();
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
  basic_formatter<char[38]>
            ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8,
             (char (*) [38])"Expected `mat#` line in `Mat1` chunk ");
  std::ostream::_M_insert<unsigned_long>((ulong)local_1b8);
  std::__cxx11::stringbuf::str();
  Logger::warn(pLVar7,local_1d8[0]);
LAB_00479444:
  if (local_1d8[0] != local_1c8) {
    operator_delete(local_1d8[0]);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
  std::ios_base::~ios_base((ios_base *)&uStack_148);
  return;
}

Assistant:

void COBImporter::ReadMat1_Ascii(Scene& out, LineSplitter& splitter, const ChunkInfo& nfo)
{
    if(nfo.version > 8) {
        return UnsupportedChunk_Ascii(splitter,nfo,"Mat1");
    }

    ++splitter;
    if (!splitter.match_start("mat# ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id );
        return;
    }

    out.materials.push_back(Material());
    Material& mat = out.materials.back();
    mat = nfo;

    mat.matnum = strtoul10(splitter[1]);
    ++splitter;

    if (!splitter.match_start("shader: ")) {
        ASSIMP_LOG_WARN_F( "Expected `mat#` line in `Mat1` chunk ", nfo.id);
        return;
    }
    std::string shader = std::string(splitter[1]);
    shader = shader.substr(0,shader.find_first_of(" \t"));

    if (shader == "metal") {
        mat.shader = Material::METAL;
    }
    else if (shader == "phong") {
        mat.shader = Material::PHONG;
    }
    else if (shader != "flat") {
        ASSIMP_LOG_WARN_F( "Unknown value for `shader` in `Mat1` chunk ", nfo.id );
    }

    ++splitter;
    if (!splitter.match_start("rgb ")) {
        ASSIMP_LOG_WARN_F( "Expected `rgb` line in `Mat1` chunk ", nfo.id);
    }

    const char* rgb = splitter[1];
    ReadFloat3Tuple_Ascii(mat.rgb,&rgb);

    ++splitter;
    if (!splitter.match_start("alpha ")) {
        ASSIMP_LOG_WARN_F( "Expected `alpha` line in `Mat1` chunk ", nfo.id);
    }

    const char* tokens[10];
    splitter.get_tokens(tokens);

    mat.alpha   = fast_atof( tokens[1] );
    mat.ka      = fast_atof( tokens[3] );
    mat.ks      = fast_atof( tokens[5] );
    mat.exp     = fast_atof( tokens[7] );
    mat.ior     = fast_atof( tokens[9] );
}